

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-light.c
# Opt level: O2

_Bool borg_check_light_only(void)

{
  uint8_t uVar1;
  short sVar2;
  borg_grid *pbVar3;
  chunk_conflict *pcVar4;
  _Bool _Var5;
  loc lVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  
  if (((borg.trait[0x69] == 0) || (borg.trait[0x70] != 0)) || (borg.trait[0x78] != 0))
  goto LAB_0021ee9d;
  if (((borg.when_wizard_light == 0) || (999 < (int)borg_t - (int)borg.when_wizard_light)) &&
     (((_Var5 = borg_activate_item(act_clairvoyance), _Var5 ||
       ((_Var5 = borg_activate_item(act_enlightenment), _Var5 ||
        (_Var5 = borg_spell_fail(FUME_OF_MORDOR,L'('), _Var5)))) ||
      (_Var5 = borg_spell_fail(CLAIRVOYANCE,L'('), _Var5)))) {
    borg_note("# Wizard lighting the dungeon");
    borg.when_wizard_light = borg_t;
LAB_0021ef34:
    _Var5 = true;
  }
  else {
    if (borg.trait[0x19] == 4) {
      if ((borg.when_call_light == 0) || (6 < (int)borg_t - (int)borg.when_call_light)) {
        iVar8 = 0;
        for (lVar7 = (long)(borg.c.y + -2); lVar7 <= borg.c.y + 2; lVar7 = lVar7 + 1) {
          lVar10 = (long)(borg.c.x + -2);
          lVar9 = lVar10 * 0xc;
          for (; pcVar4 = cave, lVar10 <= borg.c.x + 2; lVar10 = lVar10 + 1) {
            lVar6 = (loc)loc((int)lVar10,(int)lVar7);
            _Var5 = square_in_bounds_fully(pcVar4,lVar6);
            if ((_Var5) &&
               (_Var5 = borg_cave_floor_grid((borg_grid *)(&borg_grids[lVar7]->feat + lVar9)),
               pcVar4 = cave, _Var5)) {
              lVar6 = (loc)loc((int)lVar10,(int)lVar7);
              _Var5 = square_isglow(pcVar4,lVar6);
              iVar8 = iVar8 + (uint)_Var5;
            }
            lVar9 = lVar9 + 0xc;
          }
        }
        if ((10 < iVar8) && (_Var5 = borg_spell_fail(CREATE_DARKNESS,L'('), _Var5)) {
          borg_note("# Calling Darkness in the dungeon");
LAB_0021f293:
          borg.when_call_light = borg_t;
          goto LAB_0021ef34;
        }
      }
    }
    else if ((borg.when_call_light == 0) || (6 < (int)borg_t - (int)borg.when_call_light)) {
      if (borg.trait[0x1a] == 1) {
        iVar8 = 0;
        for (lVar7 = 0; pcVar4 = cave, lVar7 != 4; lVar7 = lVar7 + 1) {
          lVar10 = (long)ddx_ddd[lVar7 + 4] + (long)borg.c.x;
          lVar9 = (long)borg.c.y;
          sVar2 = ddy_ddd[lVar7 + 4];
          lVar6 = (loc)loc((int)lVar10,(int)(sVar2 + lVar9));
          _Var5 = square_in_bounds_fully(pcVar4,lVar6);
          if (_Var5) {
            uVar1 = borg_grids[sVar2 + lVar9][lVar10].feat;
            _Var5 = borg_cave_floor_grid(borg_grids[sVar2 + lVar9] + lVar10);
            iVar8 = iVar8 + (uint)!_Var5 + (uint)(uVar1 == '\0');
          }
        }
        if (2 < iVar8) goto LAB_0021ee9d;
      }
      else if (1 < borg.trait[0x1a]) {
        iVar8 = 0;
        for (lVar7 = (long)(borg.c.y + -2); lVar7 <= borg.c.y + 2; lVar7 = lVar7 + 1) {
          lVar10 = (long)(borg.c.x + -2);
          lVar9 = lVar10 * 0xc;
          for (; pcVar4 = cave, lVar10 <= borg.c.x + 2; lVar10 = lVar10 + 1) {
            lVar6 = (loc)loc((int)lVar10,(int)lVar7);
            _Var5 = square_in_bounds_fully(pcVar4,lVar6);
            if (_Var5) {
              pbVar3 = borg_grids[lVar7];
              _Var5 = borg_cave_floor_grid((borg_grid *)(&pbVar3->feat + lVar9));
              pcVar4 = cave;
              if ((_Var5) && ((*(byte *)((long)&pbVar3->info + lVar9) & 0x10) != 0)) {
                lVar6 = (loc)loc((int)lVar10,(int)lVar7);
                _Var5 = square_isglow(pcVar4,lVar6);
                iVar8 = iVar8 + (uint)!_Var5;
              }
            }
            lVar9 = lVar9 + 0xc;
          }
        }
        if (iVar8 < 0xb) goto LAB_0021ee9d;
      }
      _Var5 = borg_activate_item(act_illumination);
      if (((((_Var5) || (_Var5 = borg_activate_item(act_light), _Var5)) ||
           (_Var5 = borg_zap_rod(sv_rod_illumination), _Var5)) ||
          ((_Var5 = borg_use_staff(sv_staff_light), _Var5 ||
           (_Var5 = borg_read_scroll(sv_scroll_light), _Var5)))) ||
         ((_Var5 = borg_spell_fail(LIGHT_ROOM,L'('), _Var5 ||
          (_Var5 = borg_spell_fail(CALL_LIGHT,L'('), _Var5)))) {
        borg_note("# Illuminating the dungeon");
        borg_react("SELF:lite","SELF:lite");
        goto LAB_0021f293;
      }
    }
LAB_0021ee9d:
    _Var5 = false;
  }
  return _Var5;
}

Assistant:

bool borg_check_light_only(void)
{
    /* Never in town, when blind or when hallucinating */
    if (!borg.trait[BI_CDEPTH])
        return false;
    if (borg.trait[BI_ISBLIND] || borg.trait[BI_ISIMAGE])
        return false;

    /** Use wizard light sometimes **/
    if (!borg.when_wizard_light || (borg_t - borg.when_wizard_light >= 1000)) {
        if (borg_activate_item(act_clairvoyance)
            || borg_activate_item(act_enlightenment)
            || borg_spell_fail(FUME_OF_MORDOR, 40)
            || borg_spell_fail(CLAIRVOYANCE, 40)) {
            borg_note("# Wizard lighting the dungeon");
            /* borg_react("SELF:wizard lite", "SELF:wizard lite"); */
            borg.when_wizard_light = borg_t;
            return true;
        }
    }

    /* necromancers like the dark */
    if (borg.trait[BI_CLASS] == CLASS_NECROMANCER)
        return borg_check_dark_only();

    /** Work out if there's any reason to light */

    /* Don't bother because we only just did it */
    if (borg.when_call_light != 0 && (borg_t - borg.when_call_light) < 7)
        return false;

    if (borg.trait[BI_LIGHT] == 1) {
        int i;
        int corners = 0;

        /* Scan diagonal neighbors.
         *
         * 4 corners   3 corners    2 corners    1 corner    0 corners
         * ###         ##.  #..     ##.  #..     .#.         .#.  ... .#.
         * .@.         .@.  .@.     .@.  .@.     .@.         #@#  .@. .@.
         * ###         ###  ###     ##.  #..     ##.         .#.  ... .#.
         *
         * There's actually no way to tell which are rooms and which are
         * corridors from diagonals except 4 (always a corridor) and
         * 0 (always a room).  This is why we only use it for radius 1 light.
         */
        for (i = 4; i < 8; i++) {
            borg_grid *ag;

            /* Get location */
            int x = borg.c.x + ddx_ddd[i];
            int y = borg.c.y + ddy_ddd[i];

            /* Bounds check */
            if (!square_in_bounds_fully(cave, loc(x, y)))
                continue;

            /* Get grid */
            ag = &borg_grids[y][x];

            /* Location must be known */
            if (ag->feat == FEAT_NONE)
                corners++;

            /* Location must be a wall/door */
            if (!borg_cave_floor_grid(ag))
                corners++;
        }

        /* This is quite an arbitrary cutoff */
        if (corners > 2)
            return false;
    } else if (borg.trait[BI_LIGHT] > 1) {
        int x, y;
        int floors = 0;

        /*
         * Scan the surrounding 5x5 area for unlit tiles.
         *
         * Radius two light misses out the four corners but otherwise
         * illuminates a 5x5 grid, which is 21 grids illuminated incl player.
         *
         *  ...
         * .....
         * ..@..
         * .....
         *  ...
         */
        for (y = borg.c.y - 2; y <= borg.c.y + 2; y++) {
            for (x = borg.c.x - 2; x <= borg.c.x + 2; x++) {
                borg_grid *ag;

                /* Bounds check */
                if (!square_in_bounds_fully(cave, loc(x, y)))
                    continue;

                /* Get grid */
                ag = &borg_grids[y][x];

                /* Must be a floor grid lit by torchlight, not by magic */
                if (borg_cave_floor_grid(ag) && (ag->info & BORG_LIGHT)
                    && !square_isglow(cave, loc(x, y))) {
                    floors++;
                }
            }
        }

        /* Don't bother unless there are enough unlit floors */
        /* 11 is the empirical cutoff point for sensible behaviour here */
        if (floors < 11)
            return false;
    }

    /* Light it up! */
    if (borg_activate_item(act_illumination) 
        || borg_activate_item(act_light)
        || borg_zap_rod(sv_rod_illumination) 
        || borg_use_staff(sv_staff_light)
        || borg_read_scroll(sv_scroll_light) 
        || borg_spell_fail(LIGHT_ROOM, 40)
        || borg_spell_fail(CALL_LIGHT, 40)) {
        borg_note("# Illuminating the dungeon");
        borg_react("SELF:lite", "SELF:lite");
        borg.when_call_light = borg_t;
        return true;
    }

    return false;
}